

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O2

int Sbc_ManAddInternalToPath_rec(Gia_Man_t *p,int iObj,Vec_Bit_t *vPath)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int Entry;
  uint uVar5;
  long lVar6;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar3 = Gia_ManObj(p,iObj);
    uVar5 = (uint)*(undefined8 *)pGVar3;
    if ((~uVar5 & 0x9fffffff) != 0) {
      if ((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) {
        lVar6 = 0;
        uVar5 = 0;
        while( true ) {
          iVar1 = Gia_ObjLutSize(p,iObj);
          if (iVar1 <= lVar6) break;
          piVar4 = Gia_ObjLutFanins(p,iObj);
          uVar2 = Sbc_ManAddInternalToPath_rec(p,piVar4[lVar6],vPath);
          uVar5 = uVar5 | uVar2;
          lVar6 = lVar6 + 1;
        }
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          Vec_BitWriteEntry(vPath,iObj,Entry);
        }
        return uVar5;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                    ,0x38,"int Sbc_ManAddInternalToPath_rec(Gia_Man_t *, int, Vec_Bit_t *)");
    }
  }
  iVar1 = Vec_BitEntry(vPath,iObj);
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sbc_ManAddInternalToPath_rec( Gia_Man_t * p, int iObj, Vec_Bit_t * vPath )
{
    Gia_Obj_t * pObj; 
    int k, iFan, Value = 0;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return Vec_BitEntry(vPath, iObj);
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return Vec_BitEntry(vPath, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Value |= Sbc_ManAddInternalToPath_rec( p, iFan, vPath );
    if ( Value )
        Vec_BitWriteEntry( vPath, iObj, 1 );
    return Value;
}